

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

uint LiteScript::Syntax::ReadComment(char *text)

{
  uint uVar1;
  
  uVar1 = 0;
  if (*text == '/') {
    if (text[1] == '/') {
      for (uVar1 = 2; (text[uVar1] != '\0' && (text[uVar1] != '\n')); uVar1 = uVar1 + 1) {
      }
    }
    else {
      uVar1 = 0;
      if (text[1] == '*') {
        uVar1 = 2;
        do {
          if (text[uVar1] == '*') {
            if (text[uVar1 + 1] == '/') {
              return uVar1 + 2;
            }
          }
          else if (text[uVar1] == '\0') {
            return uVar1;
          }
          uVar1 = uVar1 + 1;
        } while( true );
      }
    }
  }
  return uVar1;
}

Assistant:

unsigned int LiteScript::Syntax::ReadComment(const char *text) {
    if (text[0] != '/')
        return 0;
    unsigned int i;
    if (text[1] == '/') {
        for (i = 2; text[i] != '\n' && text[i] != '\0'; i++);
        return i;
    }
    else if (text[1] == '*') {
        for (i = 2; text[i] != '\0'; i++) {
            if (text[i] == '*' && text[i + 1] == '/') {
                i += 2;
                break;
            }
        }
        return i;
    }
    else {
        return 0;
    }
}